

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

void cfd::capi::CheckEmptyString(char *parameter,char *name,CfdSourceLocation *location)

{
  CfdException *this;
  bool bVar1;
  allocator local_81;
  char *name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (parameter == (char *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = *parameter == '\0';
  }
  if ((name != (char *)0x0) && (bVar1)) {
    name_local = name;
    core::logger::warn<char_const*&>(location,"{} is null or empty.",&name_local);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_78,name_local,&local_81);
    std::operator+(&local_58,"Failed to parameter. ",&local_78);
    std::operator+(&local_38,&local_58," is null or empty.");
    core::CfdException::CfdException(this,kCfdIllegalArgumentError,&local_38);
    __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  return;
}

Assistant:

void CheckEmptyString(
    const char* parameter, const char* name,
    const cfd::core::logger::CfdSourceLocation& location) {
  if (IsEmptyString(parameter) && (name != nullptr)) {
    warn(location, "{} is null or empty.", name);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. " + std::string(name) + " is null or empty.");
  }
}